

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

_Bool list_exists(list *list,void *data)

{
  list_item *plVar1;
  bool bVar2;
  
  plVar1 = list->head;
  if (plVar1 == (list_item *)0x0) {
    return false;
  }
  do {
    bVar2 = plVar1->data == data;
    if (bVar2) {
      return bVar2;
    }
    plVar1 = plVar1->next;
  } while (plVar1 != (list_item *)0x0);
  return bVar2;
}

Assistant:

bool list_exists(struct list *list, void *data)
{
    struct list_item *next, *cur = NULL;
    // is list empty?
    if (list->head == NULL) {
        return false;
    }
    cur = list->head;
    while (cur != NULL) {
        next = cur->next;
        if (cur->data == data) {
            return true;
        }
        cur = next;
    }
    return false;
}